

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_pkey.c
# Opt level: O0

int encoder_import_cb(OSSL_PARAM *params,void *arg)

{
  OSSL_ENCODER_INSTANCE *encoder_inst_00;
  OSSL_ENCODER *pOVar1;
  void *pvVar2;
  long in_RSI;
  OSSL_PARAM *in_RDI;
  void *encoderctx;
  OSSL_ENCODER *encoder;
  OSSL_ENCODER_INSTANCE *encoder_inst;
  construct_data_st_conflict *construct_data;
  
  encoder_inst_00 = *(OSSL_ENCODER_INSTANCE **)(in_RSI + 0x10);
  pOVar1 = OSSL_ENCODER_INSTANCE_get_encoder(encoder_inst_00);
  pvVar2 = OSSL_ENCODER_INSTANCE_get_encoder_ctx(encoder_inst_00);
  pvVar2 = (*pOVar1->import_object)(pvVar2,*(int *)(in_RSI + 8),in_RDI);
  *(void **)(in_RSI + 0x20) = pvVar2;
  return (int)(*(long *)(in_RSI + 0x20) != 0);
}

Assistant:

static int encoder_import_cb(const OSSL_PARAM params[], void *arg)
{
    struct construct_data_st *construct_data = arg;
    OSSL_ENCODER_INSTANCE *encoder_inst = construct_data->encoder_inst;
    OSSL_ENCODER *encoder = OSSL_ENCODER_INSTANCE_get_encoder(encoder_inst);
    void *encoderctx = OSSL_ENCODER_INSTANCE_get_encoder_ctx(encoder_inst);

    construct_data->constructed_obj =
        encoder->import_object(encoderctx, construct_data->selection, params);

    return (construct_data->constructed_obj != NULL);
}